

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O1

void FastPForLib::fastpackwithoutmask(uint32_t *in,uint32_t *out,uint32_t bit)

{
  switch(bit) {
  case 0:
    __fastpackwithoutmask0(in,out);
    return;
  case 1:
    __fastpackwithoutmask1(in,out);
    return;
  case 2:
    __fastpackwithoutmask2(in,out);
    return;
  case 3:
    __fastpackwithoutmask3(in,out);
    return;
  case 4:
    __fastpackwithoutmask4(in,out);
    return;
  case 5:
    __fastpackwithoutmask5(in,out);
    return;
  case 6:
    __fastpackwithoutmask6(in,out);
    return;
  case 7:
    __fastpackwithoutmask7(in,out);
    return;
  case 8:
    __fastpackwithoutmask8(in,out);
    return;
  case 9:
    __fastpackwithoutmask9(in,out);
    return;
  case 10:
    __fastpackwithoutmask10(in,out);
    return;
  case 0xb:
    __fastpackwithoutmask11(in,out);
    return;
  case 0xc:
    __fastpackwithoutmask12(in,out);
    return;
  case 0xd:
    __fastpackwithoutmask13(in,out);
    return;
  case 0xe:
    __fastpackwithoutmask14(in,out);
    return;
  case 0xf:
    __fastpackwithoutmask15(in,out);
    return;
  case 0x10:
    __fastpackwithoutmask16(in,out);
    return;
  case 0x11:
    __fastpackwithoutmask17(in,out);
    return;
  case 0x12:
    __fastpackwithoutmask18(in,out);
    return;
  case 0x13:
    __fastpackwithoutmask19(in,out);
    return;
  case 0x14:
    __fastpackwithoutmask20(in,out);
    return;
  case 0x15:
    __fastpackwithoutmask21(in,out);
    return;
  case 0x16:
    __fastpackwithoutmask22(in,out);
    return;
  case 0x17:
    __fastpackwithoutmask23(in,out);
    return;
  case 0x18:
    __fastpackwithoutmask24(in,out);
    return;
  case 0x19:
    __fastpackwithoutmask25(in,out);
    return;
  case 0x1a:
    __fastpackwithoutmask26(in,out);
    return;
  case 0x1b:
    __fastpackwithoutmask27(in,out);
    return;
  case 0x1c:
    __fastpackwithoutmask28(in,out);
    return;
  case 0x1d:
    __fastpackwithoutmask29(in,out);
    return;
  case 0x1e:
    __fastpackwithoutmask30(in,out);
    return;
  case 0x1f:
    __fastpackwithoutmask31(in,out);
    return;
  case 0x20:
    __fastpackwithoutmask32(in,out);
    return;
  default:
    return;
  }
}

Assistant:

inline void fastpackwithoutmask(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out,
                                const uint32_t bit) {
  // Could have used function pointers instead of switch.
  // Switch calls do offer the compiler more opportunities for optimization in
  // theory. In this case, it makes no difference with a good compiler.
  switch (bit) {
  case 0:
    __fastpackwithoutmask0(in, out);
    break;
  case 1:
    __fastpackwithoutmask1(in, out);
    break;
  case 2:
    __fastpackwithoutmask2(in, out);
    break;
  case 3:
    __fastpackwithoutmask3(in, out);
    break;
  case 4:
    __fastpackwithoutmask4(in, out);
    break;
  case 5:
    __fastpackwithoutmask5(in, out);
    break;
  case 6:
    __fastpackwithoutmask6(in, out);
    break;
  case 7:
    __fastpackwithoutmask7(in, out);
    break;
  case 8:
    __fastpackwithoutmask8(in, out);
    break;
  case 9:
    __fastpackwithoutmask9(in, out);
    break;
  case 10:
    __fastpackwithoutmask10(in, out);
    break;
  case 11:
    __fastpackwithoutmask11(in, out);
    break;
  case 12:
    __fastpackwithoutmask12(in, out);
    break;
  case 13:
    __fastpackwithoutmask13(in, out);
    break;
  case 14:
    __fastpackwithoutmask14(in, out);
    break;
  case 15:
    __fastpackwithoutmask15(in, out);
    break;
  case 16:
    __fastpackwithoutmask16(in, out);
    break;
  case 17:
    __fastpackwithoutmask17(in, out);
    break;
  case 18:
    __fastpackwithoutmask18(in, out);
    break;
  case 19:
    __fastpackwithoutmask19(in, out);
    break;
  case 20:
    __fastpackwithoutmask20(in, out);
    break;
  case 21:
    __fastpackwithoutmask21(in, out);
    break;
  case 22:
    __fastpackwithoutmask22(in, out);
    break;
  case 23:
    __fastpackwithoutmask23(in, out);
    break;
  case 24:
    __fastpackwithoutmask24(in, out);
    break;
  case 25:
    __fastpackwithoutmask25(in, out);
    break;
  case 26:
    __fastpackwithoutmask26(in, out);
    break;
  case 27:
    __fastpackwithoutmask27(in, out);
    break;
  case 28:
    __fastpackwithoutmask28(in, out);
    break;
  case 29:
    __fastpackwithoutmask29(in, out);
    break;
  case 30:
    __fastpackwithoutmask30(in, out);
    break;
  case 31:
    __fastpackwithoutmask31(in, out);
    break;
  case 32:
    __fastpackwithoutmask32(in, out);
    break;
  default:
    break;
  }
}